

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

int __thiscall IlmThread_3_4::ThreadPool::numThreads(ThreadPool *this)

{
  int iVar1;
  ProviderPtr sp;
  Data local_18;
  
  Data::getProvider(&local_18);
  if (local_18._provider.
      super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (*(local_18._provider.
               super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ThreadPoolProvider[2])();
  }
  if (local_18._provider.
      super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18._provider.
               super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar1;
}

Assistant:

int
ThreadPool::numThreads () const
{
#ifdef ENABLE_THREADING
    Data::ProviderPtr sp = _data->getProvider ();
    return (sp) ? sp->numThreads () : 0;
#else
    return 0;
#endif
}